

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int32_suite::fail_array8_int32_overflow(void)

{
  undefined4 local_50;
  array<int,_1UL> value;
  size_type local_48;
  value_type input [10];
  decoder decoder;
  
  input[0] = 0xac;
  input[1] = '\b';
  input[2] = '\x11';
  input[3] = '\"';
  input[4] = '3';
  input[5] = 'D';
  input[6] = 'U';
  input[7] = 'f';
  input[8] = 'w';
  input[9] = 0x88;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[10]>(&decoder,&input);
  value._M_elems[0] = (_Type)0;
  local_48 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::int32>::decode(&decoder,value._M_elems,1);
  local_50 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x8c0,"void compact_int32_suite::fail_array8_int32_overflow()",&local_48,&local_50);
  return;
}

Assistant:

void fail_array8_int32_overflow()
{
    const value_type input[] = { token::code::array8_int32, 0x08, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    std::array<std::int32_t, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}